

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O0

void __thiscall bidirectional::Search::replaceBestLabel(Search *this,int *lemon_id,Label *label)

{
  int *in_RSI;
  Label *in_RDI;
  shared_ptr<labelling::Label> label_ptr;
  __shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffc8;
  
  std::make_shared<labelling::Label,labelling::Label_const&>(in_RDI);
  std::
  vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>::
  operator[]((vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
              *)&in_RDI[1].vertex,(long)*in_RSI);
  std::__shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>::swap
            ((__shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,
             in_stack_ffffffffffffffc8);
  std::shared_ptr<labelling::Label>::~shared_ptr((shared_ptr<labelling::Label> *)0x24a3ec);
  return;
}

Assistant:

void replaceBestLabel(const int& lemon_id, const labelling::Label& label) {
    auto label_ptr = std::make_shared<labelling::Label>(label);
    best_labels[lemon_id].swap(label_ptr);
  }